

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

bool GetVarAddrType(AActor *self,FName *varname,int index,void **addr,PType **type,bool readonly)

{
  PType *p;
  bool bVar1;
  PClass *pPVar2;
  DObject *p_00;
  PField *pPVar3;
  PArray *pPVar4;
  PClass *pPVar5;
  PClass *pPVar6;
  void *pvVar7;
  FName local_34;
  
  pPVar2 = DObject::GetClass((DObject *)self);
  p_00 = (DObject *)
         PSymbolTable::FindSymbol
                   (&(pPVar2->super_PNativeStruct).super_PStruct.super_PNamedType.
                     super_PCompoundType.super_PType.Symbols,&local_34,true);
  pPVar3 = dyn_cast<PField>(p_00);
  if ((pPVar3 != (PField *)0x0) && ((readonly || ((pPVar3->Flags & 8) == 0)))) {
    p = pPVar3->Type;
    *type = p;
    pvVar7 = (void *)((long)&(self->super_DThinker).super_DObject._vptr_DObject + pPVar3->Offset);
    pPVar4 = dyn_cast<PArray>((DObject *)p);
    if (pPVar4 == (PArray *)0x0) {
      if (index != 0) {
        return false;
      }
    }
    else {
      *type = pPVar4->ElementType;
      if (pPVar4->ElementCount <= (uint)index) {
        return false;
      }
      pvVar7 = (void *)((long)pvVar7 + (ulong)(index * pPVar4->ElementSize));
    }
    *addr = pvVar7;
    pPVar2 = PInt::RegistrationInfo.MyClass;
    pPVar5 = DObject::GetClass((DObject *)*type);
    if (pPVar5 == pPVar2) {
      return true;
    }
    bVar1 = DObject::IsKindOf((DObject *)*type,PFloat::RegistrationInfo.MyClass);
    pPVar2 = PName::RegistrationInfo.MyClass;
    if (bVar1) {
      return true;
    }
    if (readonly) {
      pPVar6 = DObject::GetClass((DObject *)*type);
      pPVar5 = PString::RegistrationInfo.MyClass;
      if (pPVar6 == pPVar2) {
        return true;
      }
      pPVar2 = DObject::GetClass((DObject *)*type);
      if (pPVar2 == pPVar5) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool GetVarAddrType(AActor *self, FName varname, int index, void *&addr, PType *&type, bool readonly)
{
	PField *var = dyn_cast<PField>(self->GetClass()->Symbols.FindSymbol(varname, true));
	PArray *arraytype;

	if (var == NULL || (!readonly && (var->Flags & VARF_Native)))
	{
		return false;
	}
	type = var->Type;
	BYTE *baddr = reinterpret_cast<BYTE *>(self) + var->Offset;
	arraytype = dyn_cast<PArray>(type);
	if (arraytype != NULL)
	{
		// unwrap contained type
		type = arraytype->ElementType;
		// offset by index (if in bounds)
		if ((unsigned)index >= arraytype->ElementCount)
		{ // out of bounds
			return false;
		}
		baddr += arraytype->ElementSize * index;
	}
	else if (index != 0)
	{ // ignore attempts to set indexed values on non-arrays
		return false;
	}
	addr = baddr;
	// We don't want Int subclasses like Name or Color to be accessible,
	// but we do want to support Float subclasses like Fixed.
	if (!type->IsA(RUNTIME_CLASS(PInt)) && !type->IsKindOf(RUNTIME_CLASS(PFloat)))
	{
		// For reading, we also support Name and String types.
		if (readonly && (type->IsA(RUNTIME_CLASS(PName)) || type->IsA(RUNTIME_CLASS(PString))))
		{
			return true;
		}
		return false;
	}
	return true;
}